

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

Terminator * __thiscall soul::Optimisations::Inliner::cloneTerminator(Inliner *this,Terminator *s)

{
  int iVar1;
  __fn *p_Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *in_R8;
  
  iVar1 = 0;
  p_Var2 = (__fn *)__dynamic_cast(s,&heart::Terminator::typeinfo,&heart::Branch::typeinfo);
  if (p_Var2 != (__fn *)0x0) {
    iVar1 = clone(this,p_Var2,__child_stack,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = 0;
  p_Var2 = (__fn *)__dynamic_cast(s,&heart::Terminator::typeinfo,&heart::BranchIf::typeinfo);
  if (p_Var2 != (__fn *)0x0) {
    iVar1 = clone(this,p_Var2,__child_stack_00,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var_00,iVar1);
  }
  iVar1 = 0;
  p_Var2 = (__fn *)__dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnVoid::typeinfo);
  if (p_Var2 != (__fn *)0x0) {
    iVar1 = clone(this,p_Var2,__child_stack_01,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var_01,iVar1);
  }
  iVar1 = 0;
  p_Var2 = (__fn *)__dynamic_cast(s,&heart::Terminator::typeinfo,&heart::ReturnValue::typeinfo);
  if (p_Var2 != (__fn *)0x0) {
    iVar1 = clone(this,p_Var2,__child_stack_02,iVar1,in_R8);
    return (Terminator *)CONCAT44(extraout_var_02,iVar1);
  }
  throwInternalCompilerError("cloneTerminator",0x26a);
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
        {
            #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
            SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
            #undef SOUL_CLONE_TERMINATOR
            SOUL_ASSERT_FALSE;
            return s;
        }